

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pd~.c
# Opt level: O2

void * pd_tilde_new(t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  t_object *owner;
  char *pcVar2;
  t_symbol *ptVar3;
  t_pd p_Var4;
  void *pvVar5;
  _glist *p_Var6;
  _binbuf *p_Var7;
  _outlet *p_Var8;
  int iVar9;
  t_float tVar10;
  long lStack_60;
  undefined4 local_50;
  int local_4c;
  int local_48;
  t_float local_44;
  _inlet *local_40;
  _outlet *local_38;
  
  owner = (t_object *)pd_new(pd_tilde_class);
  local_44 = sys_getsr();
  local_38 = (_outlet *)sys_libdir;
  pcVar2 = class_gethelpdir(pd_tilde_class);
  local_40 = (_inlet *)gensym(pcVar2);
  local_4c = 5;
  iVar9 = 2;
  local_48 = 2;
  local_50 = 1;
  for (; 0 < argc; argc = argc + iVar1) {
    ptVar3 = atom_getsymbolarg(0,argc,argv);
    pcVar2 = ptVar3->s_name;
    iVar1 = strcmp(pcVar2,"-sr");
    if ((argc == 1) || (iVar1 != 0)) {
      iVar1 = strcmp(pcVar2,"-ninsig");
      if ((argc != 1) && (iVar1 == 0)) {
        tVar10 = atom_getfloatarg(1,argc,argv);
        iVar9 = (int)tVar10;
        goto LAB_0019f3d2;
      }
      iVar1 = strcmp(pcVar2,"-noutsig");
      if ((argc != 1) && (iVar1 == 0)) {
        tVar10 = atom_getfloatarg(1,argc,argv);
        local_48 = (int)tVar10;
        goto LAB_0019f3d2;
      }
      iVar1 = strcmp(pcVar2,"-fifo");
      if ((argc != 1) && (iVar1 == 0)) {
        tVar10 = atom_getfloatarg(1,argc,argv);
        local_4c = (int)tVar10;
        goto LAB_0019f3d2;
      }
      iVar1 = strcmp(pcVar2,"-pddir");
      if ((argc != 1) && (iVar1 == 0)) {
        local_38 = (_outlet *)atom_getsymbolarg(1,argc,argv);
        goto LAB_0019f3d2;
      }
      iVar1 = strcmp(pcVar2,"-scheddir");
      if ((argc != 1) && (iVar1 == 0)) {
        local_40 = (_inlet *)atom_getsymbolarg(1,argc,argv);
        goto LAB_0019f3d2;
      }
      iVar1 = strcmp(pcVar2,"-ascii");
      if (iVar1 != 0) goto LAB_0019f407;
      iVar1 = -1;
      lStack_60 = 0x10;
      local_50 = 0;
    }
    else {
      local_44 = atom_getfloatarg(1,argc,argv);
LAB_0019f3d2:
      iVar1 = -2;
      lStack_60 = 0x20;
    }
    argv = (t_atom *)((long)&argv->a_type + lStack_60);
  }
  if (argc != 0) {
LAB_0019f407:
    pd_error(owner,"usage: pd~ [-sr #] [-ninsig #] [-noutsig #] [-fifo #] [-pddir <>]");
    post("... [-scheddir <>]");
  }
  p_Var4 = (t_pd)clock_new(owner,pd_tilde_tick);
  owner[1].te_g.g_pd = p_Var4;
  pvVar5 = getbytes((long)iVar9 * 8);
  *(void **)&owner[2].te_xpix = pvVar5;
  p_Var4 = (t_pd)getbytes((long)local_48 * 8);
  owner[3].te_g.g_pd = p_Var4;
  *(int *)((long)&owner[2].te_g.g_pd + 4) = iVar9;
  *(int *)&owner[2].te_g.g_next = local_48;
  *(undefined4 *)&owner[3].te_g.g_next = 0x40;
  *(int *)((long)&owner[2].te_g.g_next + 4) = local_4c;
  *(t_float *)((long)&owner[2].te_binbuf + 4) = local_44;
  owner[2].te_outlet = local_38;
  owner[2].te_inlet = local_40;
  owner[1].te_outlet = (_outlet *)0x0;
  owner[1].te_inlet = (_inlet *)0x0;
  *(undefined4 *)&owner[2].te_g.g_pd = 0xffffffff;
  p_Var6 = canvas_getcurrent();
  owner[1].te_binbuf = (_binbuf *)p_Var6;
  p_Var7 = binbuf_new();
  *(_binbuf **)&owner[1].te_xpix = p_Var7;
  *(undefined4 *)&owner[2].te_binbuf = local_50;
  for (iVar1 = 1; iVar1 < iVar9; iVar1 = iVar1 + 1) {
    inlet_new(owner,(t_pd *)owner,&s_signal,&s_signal);
  }
  p_Var8 = outlet_new(owner,(t_symbol *)0x0);
  owner[1].te_g.g_next = (_gobj *)p_Var8;
  iVar9 = 0;
  if (0 < local_48) {
    iVar9 = local_48;
  }
  while (iVar9 != 0) {
    outlet_new(owner,&s_signal);
    iVar9 = iVar9 + -1;
  }
  signal(0xd,(__sighandler_t)0x1);
  return owner;
}

Assistant:

static void *pd_tilde_new(t_symbol *s, int argc, t_atom *argv)
{
    t_pd_tilde *x = (t_pd_tilde *)pd_new(pd_tilde_class);
    int ninsig = 2, noutsig = 2, j, fifo = 5, binary = 1;
    t_float sr = sys_getsr();
    t_pdsample **g;
    t_symbol *pddir = sys_libdir,
        *scheddir = gensym(class_gethelpdir(pd_tilde_class));
    while (argc > 0)
    {
        t_symbol *firstarg = atom_getsymbolarg(0, argc, argv);
        if (!strcmp(firstarg->s_name, "-sr") && argc > 1)
        {
            sr = atom_getfloatarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-ninsig") && argc > 1)
        {
            ninsig = atom_getfloatarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-noutsig") && argc > 1)
        {
            noutsig = atom_getfloatarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-fifo") && argc > 1)
        {
            fifo = atom_getfloatarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-pddir") && argc > 1)
        {
            pddir = atom_getsymbolarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-scheddir") && argc > 1)
        {
            scheddir = atom_getsymbolarg(1, argc, argv);
            argc -= 2; argv += 2;
        }
        else if (!strcmp(firstarg->s_name, "-ascii"))
        {
            binary = 0;
            argc--; argv++;
        }
        else break;
    }

    if (argc)
    {
        pd_error(x,
"usage: pd~ [-sr #] [-ninsig #] [-noutsig #] [-fifo #] [-pddir <>]");
        post(
"... [-scheddir <>]");
    }

    x->x_clock = clock_new(x, (t_method)pd_tilde_tick);
    x->x_insig = (t_pdsample **)t_getbytes(ninsig * sizeof(*x->x_insig));
    x->x_outsig = (t_pdsample **)t_getbytes(noutsig * sizeof(*x->x_outsig));
    x->x_ninsig = ninsig;
    x->x_noutsig = noutsig;
    x->x_blksize = DEFDACBLKSIZE;
    x->x_fifo = fifo;
    x->x_sr = sr;
    x->x_pddir = pddir;
    x->x_schedlibdir = scheddir;
    x->x_infd = 0;
    x->x_outfd = 0;
    x->x_childpid = -1;
    x->x_canvas = canvas_getcurrent();
    x->x_binbuf = binbuf_new();
    x->x_binary = binary;
    for (j = 1, g = x->x_insig; j < ninsig; j++, g++)
        inlet_new(&x->x_obj, &x->x_obj.ob_pd, &s_signal, &s_signal);
    x->x_outlet1 = outlet_new(&x->x_obj, 0);
    for (j = 0, g = x->x_outsig; j < noutsig; j++, g++)
        outlet_new(&x->x_obj, &s_signal);
#ifndef _WIN32
    signal(SIGPIPE, SIG_IGN);
#endif
    return (x);
}